

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O0

double __thiscall VertexClustering::totalEnergy(VertexClustering *this)

{
  size_type sVar1;
  reference ppVVar2;
  long in_RDI;
  double extraout_XMM0_Qa;
  int i;
  double energy;
  int local_14;
  double local_10;
  
  local_10 = 0.0;
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<VCCluster_*,_std::allocator<VCCluster_*>_>::size
                      ((vector<VCCluster_*,_std::allocator<VCCluster_*>_> *)(in_RDI + 0x10));
    if (sVar1 <= (ulong)(long)local_14) break;
    ppVVar2 = std::vector<VCCluster_*,_std::allocator<VCCluster_*>_>::operator[]
                        ((vector<VCCluster_*,_std::allocator<VCCluster_*>_> *)(in_RDI + 0x10),
                         (long)local_14);
    (*(*ppVVar2)->_vptr_VCCluster[4])();
    local_10 = extraout_XMM0_Qa + local_10;
    local_14 = local_14 + 1;
  }
  return local_10;
}

Assistant:

double VertexClustering::totalEnergy() {
	double energy = 0;
	for (int i = 0; i < clusters.size(); ++i) {
		energy += clusters[i]->energy();
	}
	return energy;
}